

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptStringObject::GetPropertyQuery
          (JavascriptStringObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ScriptContext *this_00;
  bool bVar1;
  PropertyQueryFlags PVar2;
  BOOL BVar3;
  JavascriptString *pJVar4;
  Var aValue;
  RecyclableObject *pRVar5;
  int local_38;
  charcount_t local_34;
  BOOL result;
  uint32 index;
  
  bVar1 = GetPropertyBuiltIns(this,propertyId,value,(ScriptContext *)value,&local_38);
  if (!bVar1) {
    PVar2 = DynamicObject::GetPropertyQuery
                      (&this->super_DynamicObject,originalInstance,propertyId,value,info,
                       requestContext);
    if (PVar2 == Property_Found) {
      return Property_Found;
    }
    this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
               ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    BVar3 = ScriptContext::IsNumericPropertyId(this_00,propertyId,&local_34);
    if (BVar3 == 0) {
      pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar5;
      return Property_NotFound;
    }
    pJVar4 = InternalUnwrap(this);
    aValue = CrossSite::MarshalVar(requestContext,pJVar4,this_00);
    pJVar4 = VarTo<Js::JavascriptString>(aValue);
    local_38 = JavascriptString::GetItemAt(pJVar4,local_34,value);
  }
  return (uint)(local_38 != 0);
}

Assistant:

PropertyQueryFlags JavascriptStringObject::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL result;
        if (GetPropertyBuiltIns(propertyId, value, requestContext, &result))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(result);
        }

        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }

        // For NumericPropertyIds check that index is less than JavascriptString length
        ScriptContext*scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            JavascriptString* str = this->InternalUnwrap();
            str = VarTo<JavascriptString>(CrossSite::MarshalVar(requestContext, str, scriptContext));

            return JavascriptConversion::BooleanToPropertyQueryFlags(str->GetItemAt(index, value));
        }

        *value = requestContext->GetMissingPropertyResult();
        return PropertyQueryFlags::Property_NotFound;
    }